

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O0

void event_track::write_event_track_cmaf_header(uint32_t track_id,uint32_t timescale,ostream *ot)

{
  pointer puVar1;
  byte bVar2;
  reference pvVar3;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> sparse_moov;
  ostream *ot_local;
  uint32_t timescale_local;
  uint32_t track_id_local;
  
  sparse_moov.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)ot;
  base64_decode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                &moov_64_enc_abi_cxx11_);
  fmp4_stream::set_track_id
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,track_id);
  pvVar3 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x1c);
  anon_unknown.dwarf_1114d2::fmp4_write_uint32(timescale,(char *)pvVar3);
  pvVar3 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0xf4);
  anon_unknown.dwarf_1114d2::fmp4_write_uint32(timescale,(char *)pvVar3);
  pvVar3 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x220);
  anon_unknown.dwarf_1114d2::fmp4_write_uint32(track_id,(char *)pvVar3);
  set_evte((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  bVar2 = std::ios::good();
  if ((bVar2 & 1) != 0) {
    std::ostream::write((char *)sparse_moov.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,0x201ac0);
    puVar1 = sparse_moov.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pvVar3 = Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0);
    Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    std::ostream::write((char *)puVar1,(long)pvVar3);
  }
  Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

void event_track::write_event_track_cmaf_header(uint32_t track_id, uint32_t timescale, std::ostream &ot)
{
	std::vector<uint8_t> sparse_moov = base64_decode(moov_64_enc);
	set_track_id(sparse_moov, track_id);

	// write back the timescale mvhd / mhd
	fmp4_write_uint32(timescale, (char*) &sparse_moov[28]);
	fmp4_write_uint32(timescale, (char*) &sparse_moov[244]);
	fmp4_write_uint32(track_id,  (char*)  &sparse_moov[544]);
	event_track::set_evte(sparse_moov);

	if (ot.good())
	{
		// write the ftyp header
		ot.write((char*)&sparse_ftyp[0], 20);
		ot.write((const char*)&sparse_moov[0], sparse_moov.size());
	}
	
	return;
}